

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void next_exaggerated_phase(Am_Object *interp)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Am_Value *pAVar6;
  Am_Wrapper *value;
  Am_Object local_150;
  int local_144;
  Am_Object local_140;
  undefined1 local_138 [8];
  Am_Object_Method method;
  Am_Value local_118;
  Am_Value local_108;
  Am_Value local_f8;
  float local_e4;
  undefined1 local_dd;
  float attenuation;
  undefined1 local_d8 [3];
  bool values_waiting;
  int curr_phase;
  Am_Value_List values;
  int which_wiggle;
  int wiggle_count;
  Am_Value local_b0;
  Am_Value local_a0;
  Am_Value local_90;
  int local_7c;
  undefined1 local_78 [4];
  int next_state;
  Am_Value target;
  Am_Time duration;
  Am_Value value2;
  Am_Value value1;
  undefined1 local_30 [8];
  Am_Value curr_value;
  Am_Object subanimator;
  int curr_state;
  Am_Object *interp_local;
  
  pAVar6 = Am_Object::Get(interp,0x111,0);
  uVar3 = Am_Value::operator_cast_to_int(pAVar6);
  Am_Object::Get_Object((Am_Object *)&curr_value.value,(Am_Slot_Key)interp,0x108);
  pAVar6 = Am_Object::Get((Am_Object *)&curr_value.value,0x169,0);
  Am_Value::Am_Value((Am_Value *)local_30,pAVar6);
  pAVar6 = Am_Object::Get(interp,0x181,0);
  Am_Value::Am_Value((Am_Value *)&value2.value,pAVar6);
  pAVar6 = Am_Object::Get(interp,0x182,0);
  Am_Value::Am_Value((Am_Value *)&duration,pAVar6);
  bVar1 = Am_Value::Valid((Am_Value *)local_30);
  if (!bVar1) {
    Am_Value::operator=((Am_Value *)local_30,(Am_Value *)&value2.value);
  }
  Am_Time::Am_Time((Am_Time *)&target.value);
  Am_Value::Am_Value((Am_Value *)local_78);
  if (uVar3 == 0xfffffffe) {
    pAVar6 = Am_Object::Get(interp,0x10d,0);
    Am_Time::operator=((Am_Time *)&target.value,pAVar6);
    Am_Value::Am_Value(&local_a0,(Am_Value *)&value2.value);
    pAVar6 = Am_Object::Get(interp,0x10c,0);
    Am_Value::Am_Value(&local_b0,pAVar6);
    Am_Value::Am_Value((Am_Value *)&which_wiggle,(Am_Value *)&duration);
    add_offset(&local_90,&local_a0,(Direction)&local_b0,(Am_Value *)0x0,1.0);
    Am_Value::operator=((Am_Value *)local_78,&local_90);
    Am_Value::~Am_Value(&local_90);
    Am_Value::~Am_Value((Am_Value *)&which_wiggle);
    Am_Value::~Am_Value(&local_b0);
    Am_Value::~Am_Value(&local_a0);
    local_7c = -1;
  }
  else if (uVar3 == 0xffffffff) {
    pAVar6 = Am_Object::Get(interp,0xff,0);
    Am_Time::operator=((Am_Time *)&target.value,pAVar6);
    Am_Value::operator=((Am_Value *)local_78,(Am_Value *)&duration);
    local_7c = 0;
  }
  else {
    pAVar6 = Am_Object::Get(interp,0x10e,0);
    values.item._4_4_ = Am_Value::operator_cast_to_int(pAVar6);
    values.item._0_4_ = uVar3;
    pAVar6 = Am_Object::Get(interp,0xfa,0);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_d8,pAVar6);
    pAVar6 = Am_Object::Get(interp,0xfb,0);
    attenuation = (float)Am_Value::operator_cast_to_int(pAVar6);
    iVar4 = (int)attenuation + 1;
    uVar2 = Am_Value_List::Length((Am_Value_List *)local_d8);
    local_dd = iVar4 < (int)(uVar2 - 1);
    if (((bool)local_dd) || (values.item._4_4_ <= (int)(uint)values.item)) {
      Am_Object::Set(interp,0x169,(Am_Value *)&duration,0);
      Am_Object::Set(interp,0x111,-1,0);
      pAVar6 = Am_Object::Get(interp,200,0);
      Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_138,pAVar6);
      bVar1 = Am_Object_Method::Valid((Am_Object_Method *)local_138);
      if (bVar1) {
        Am_Object::Am_Object(&local_140,interp);
        (*(code *)method.from_wrapper)(&local_140);
        Am_Object::~Am_Object(&local_140);
      }
      local_144 = 1;
    }
    else {
      pAVar6 = Am_Object::Get(interp,0x110,0);
      Am_Time::operator=((Am_Time *)&target.value,pAVar6);
      local_e4 = 1.0 - (float)(int)(uint)values.item / (float)values.item._4_4_;
      Am_Value::Am_Value(&local_108,(Am_Value *)&duration);
      pAVar6 = Am_Object::Get(interp,0x10f,0);
      Am_Value::Am_Value(&local_118,pAVar6);
      uVar5 = (uint)values.item & 1;
      Am_Value::Am_Value((Am_Value *)&method.Call,(Am_Value *)&value2.value);
      add_offset(&local_f8,&local_108,(Direction)&local_118,(Am_Value *)(ulong)uVar5,local_e4);
      Am_Value::operator=((Am_Value *)local_78,&local_f8);
      Am_Value::~Am_Value(&local_f8);
      Am_Value::~Am_Value((Am_Value *)&method.Call);
      Am_Value::~Am_Value(&local_118);
      Am_Value::~Am_Value(&local_108);
      local_7c = uVar3 + 1;
      local_144 = 0;
    }
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_d8);
    if (local_144 != 0) goto LAB_00206ece;
  }
  Am_Object::Set(interp,0x111,local_7c,0);
  value = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)&target.value);
  Am_Object::Set((Am_Object *)&curr_value.value,0xfd,value,0);
  Am_Object::Am_Object(&local_150,(Am_Object *)&curr_value.value);
  Am_Start_Animator(&local_150,(Am_Value *)local_30,(Am_Value *)local_78);
  Am_Object::~Am_Object(&local_150);
  local_144 = 0;
LAB_00206ece:
  Am_Value::~Am_Value((Am_Value *)local_78);
  Am_Time::~Am_Time((Am_Time *)&target.value);
  Am_Value::~Am_Value((Am_Value *)&duration);
  Am_Value::~Am_Value((Am_Value *)&value2.value);
  Am_Value::~Am_Value((Am_Value *)local_30);
  Am_Object::~Am_Object((Am_Object *)&curr_value.value);
  return;
}

Assistant:

static void
next_exaggerated_phase(Am_Object interp)
{
  int curr_state = interp.Get(Am_EXAGGERATOR_STATE);
  Am_Object subanimator = interp.Get_Object(Am_SUB_ANIMATOR);
  Am_Value curr_value = subanimator.Get(Am_VALUE);
  Am_Value value1 = interp.Get(Am_VALUE_1);
  Am_Value value2 = interp.Get(Am_VALUE_2);
  if (!curr_value.Valid())
    curr_value = value1;

  Am_Time duration;
  Am_Value target;
  int next_state;

  switch (curr_state) {
  case Am_EXAGGERATOR_IDLE:
    //
    // enter WINDUP phase
    //
    duration = interp.Get(Am_WINDUP_DELAY);
    target = add_offset(value1, interp.Get(Am_WINDUP_AMOUNT), AWAYFROM, value2);
    next_state = Am_EXAGGERATOR_WINDUP;
    break;

  case Am_EXAGGERATOR_WINDUP:
    //
    // enter INTERPOLATING phase
    //
    duration = interp.Get(Am_CURRENT_DURATION);
    target = value2;
    next_state = Am_EXAGGERATOR_INTERPOLATING;
    break;

  case Am_EXAGGERATOR_INTERPOLATING:
  default: {
    //
    // enter WIGGLING phase
    //
    int wiggle_count = interp.Get(Am_WIGGLES);
    int which_wiggle = curr_state - Am_EXAGGERATOR_INTERPOLATING;

    // also check whether there are any values waiting to be visited
    // skip the wiggling if there are (we'll just wiggle on the last one)
    Am_Value_List values = interp.Get(Am_VALUES);
    int curr_phase = interp.Get(Am_CURRENT_PHASE);
    bool values_waiting = (curr_phase + 1 < ((int)values.Length()) - 1);

    if (!values_waiting && which_wiggle < wiggle_count) {
      duration = interp.Get(Am_WIGGLE_DELAY);

      float attenuation = 1 - ((float)which_wiggle) / wiggle_count;

      target = add_offset(value2, interp.Get(Am_WIGGLE_AMOUNT),
                          (which_wiggle & 1) ? TOWARDS : AWAYFROM, value1,
                          attenuation);
      next_state = curr_state + 1;
    } else {
      // call INTERIM_DO to get next segment of path (if any)
      // pretend we've just done a windup at value2, so that the next segment of the path won't include a windup
      interp.Set(Am_VALUE, value2);
      interp.Set(Am_EXAGGERATOR_STATE, Am_EXAGGERATOR_WINDUP);

      Am_Object_Method method = interp.Get(Am_INTERIM_DO_METHOD);
      if (method.Valid())
        method.Call(interp);
      return;
    }
  }
  }

  interp.Set(Am_EXAGGERATOR_STATE, next_state);

  // set up sub animator to do the actual animation
  subanimator.Set(Am_DURATION, duration);
  Am_Start_Animator(subanimator, curr_value, target);
}